

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_compat.c
# Opt level: O1

EVsource old_EVcreate_submit_handle_free
                   (CManager cm,EVstone stone,CMFormatList format_list,EVFreeFunction free_func,
                   void *client_data)

{
  FMFieldList list;
  int iVar1;
  CMFormatList pCVar2;
  FMStructDescList data_format;
  EVsource p_Var3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  
  uVar6 = (ulong)(uint)stone;
  uVar7 = 0;
  for (pCVar2 = format_list;
      (format_list != (CMFormatList)0x0 && (pCVar2->format_name != (char *)0x0));
      pCVar2 = pCVar2 + 1) {
    uVar7 = uVar7 + 1;
  }
  uVar4 = (ulong)uVar7;
  data_format = (FMStructDescList)INT_CMmalloc(uVar4 * 0x20 + 0x20);
  if (uVar7 != 0) {
    lVar5 = 0;
    do {
      *(undefined8 *)((long)&data_format->format_name + lVar5 * 2) =
           *(undefined8 *)((long)&format_list->format_name + lVar5);
      list = *(FMFieldList *)((long)&format_list->field_list + lVar5);
      *(FMFieldList *)((long)&data_format->field_list + lVar5 * 2) = list;
      iVar1 = struct_size_field_list(list,(int)uVar6);
      *(int *)((long)&data_format->struct_size + lVar5 * 2) = iVar1;
      *(undefined8 *)((long)&data_format->opt_info + lVar5 * 2) = 0;
      lVar5 = lVar5 + 0x10;
    } while (uVar4 << 4 != lVar5);
  }
  data_format[uVar4].format_name = (char *)0x0;
  data_format[uVar4].field_list = (FMFieldList)0x0;
  p_Var3 = EVcreate_submit_handle_free(cm,stone,data_format,free_func,client_data);
  return p_Var3;
}

Assistant:

extern EVsource
old_EVcreate_submit_handle_free(CManager cm, EVstone stone, CMFormatList format_list,
			    EVFreeFunction free_func, void *client_data)
{
    FMStructDescList structs;
    int count = 0, i;
    while (format_list && (format_list[count].format_name != NULL)) count++;
    structs = malloc(sizeof(structs[0]) * (count + 1));
    for (i = 0; i < count; i++) {
	structs[i].format_name = format_list[i].format_name;
	structs[i].field_list = format_list[i].field_list;
	structs[i].struct_size = struct_size_field_list(structs[i].field_list, (int)sizeof(char*));
	structs[i].opt_info = NULL;
    }
    structs[count].format_name = NULL;
    structs[count].field_list = NULL;
    return EVcreate_submit_handle_free(cm, stone, structs, free_func, client_data);
}